

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddUnaryOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,uint32_t operand1)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t res_id;
  IRContext *pIVar1;
  Instruction *pIVar2;
  Operand *local_d8;
  allocator<spvtools::opt::Operand> local_c5;
  uint32_t local_c4;
  iterator local_c0;
  undefined8 local_b8;
  SmallVector<unsigned_int,_2UL> local_b0;
  Operand local_88;
  iterator local_58;
  _func_int **local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newUnOp;
  uint32_t result_id;
  uint32_t operand1_local;
  Op opcode_local;
  uint32_t type_id_local;
  InstructionBuilder *this_local;
  
  newUnOp._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ = 0;
  newUnOp._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = operand1;
  if (type_id != 0) {
    pIVar1 = GetContext(this);
    newUnOp._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
         IRContext::TakeNextId(pIVar1);
    if ((uint32_t)
        newUnOp._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl == 0) {
      return (Instruction *)0x0;
    }
  }
  pIVar2 = (Instruction *)operator_new(0x70);
  pIVar1 = GetContext(this);
  res_id = (uint32_t)
           newUnOp._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_c4 = newUnOp._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_c0 = &local_c4;
  local_b8 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_c0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b0,init_list);
  Operand::Operand(&local_88,SPV_OPERAND_TYPE_ID,&local_b0);
  local_58 = &local_88;
  local_50 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_c5);
  __l._M_len = (size_type)local_50;
  __l._M_array = local_58;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_48,__l,&local_c5);
  Instruction::Instruction(pIVar2,pIVar1,opcode,type_id,res_id,&local_48);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_30,pIVar2);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_c5);
  local_d8 = (Operand *)&local_58;
  do {
    local_d8 = local_d8 + -1;
    Operand::~Operand(local_d8);
  } while (local_d8 != &local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b0);
  pIVar2 = AddInstruction(this,&local_30);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_30);
  return pIVar2;
}

Assistant:

Instruction* AddUnaryOp(uint32_t type_id, spv::Op opcode, uint32_t operand1) {
    uint32_t result_id = 0;
    if (type_id != 0) {
      result_id = GetContext()->TakeNextId();
      if (result_id == 0) {
        return nullptr;
      }
    }
    std::unique_ptr<Instruction> newUnOp(new Instruction(
        GetContext(), opcode, type_id, result_id,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand1}}}));
    return AddInstruction(std::move(newUnOp));
  }